

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::sessionFixtureTimeIsOutsideSessionTimeHelper::RunImpl
          (sessionFixtureTimeIsOutsideSessionTimeHelper *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  UtcTimeStamp outsideSessionTime;
  TestDetails local_40;
  UtcTimeStamp local_20;
  
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_date = 0;
  (this->super_sessionFixture).super_TestCallback.startTime.super_DateTime.m_time = 0x1aa324d61000;
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_date = 0;
  (this->super_sessionFixture).super_TestCallback.endTime.super_DateTime.m_time = 0x354649ac2000;
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0xffffffff,0xffffffff);
  local_20.super_DateTime.m_date = 0x2584e6;
  local_20.super_DateTime.m_time = 0x4297dc172800;
  local_20.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00326368;
  bVar1 = FIX::TimeRange::isInRange
                    ((TimeRange *)((this->super_sessionFixture).object + 0x178),&local_20);
  if (bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x65f);
    UnitTest::TestResults::OnTestFailure
              (this_00,&local_40,"!object->isSessionTime(outsideSessionTime)");
  }
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, TimeIsOutsideSessionTime) {
  UtcTimeStamp fixedStartTime = UtcTimeStamp(8, 8, 8, 5, 13, 2019);
  UtcTimeStamp fixedEndTime = UtcTimeStamp(16, 16, 16, 5, 13, 2019);

  startTime = UtcTimeOnly( fixedStartTime );
  endTime = UtcTimeOnly( fixedEndTime );
  createSession(1);

  UtcTimeStamp outsideSessionTime = UtcTimeStamp(20, 20, 20, 5, 13, 2019);

  CHECK(!object->isSessionTime(outsideSessionTime));
}